

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

QLineF * __thiscall QVariant::toLineF(QLineF *__return_storage_ptr__,QVariant *this)

{
  qvariant_cast<QLineF>(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

QLineF QVariant::toLineF() const
{
    return qvariant_cast<QLineF>(*this);
}